

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void do_eat(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iCond;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_RDI;
  AFFECT_DATA af;
  int condition;
  OBJ_DATA *obj;
  char arg [4608];
  CHAR_DATA *in_stack_ffffffffffffed58;
  char *in_stack_ffffffffffffed60;
  CHAR_DATA *ch_01;
  undefined4 in_stack_ffffffffffffed68;
  undefined4 in_stack_ffffffffffffed6c;
  char *in_stack_ffffffffffffed70;
  OBJ_DATA *in_stack_ffffffffffffed80;
  undefined4 in_stack_ffffffffffffeda8;
  undefined4 in_stack_ffffffffffffedac;
  CHAR_DATA *in_stack_ffffffffffffedb0;
  CHAR_DATA *in_stack_ffffffffffffedb8;
  int in_stack_ffffffffffffedc0;
  int in_stack_ffffffffffffedc4;
  int in_stack_ffffffffffffedd8;
  char local_1218;
  CHAR_DATA *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  CHAR_DATA *in_stack_ffffffffffffff78;
  
  one_argument(in_stack_ffffffffffffed60,(char *)in_stack_ffffffffffffed58);
  if (local_1218 == '\0') {
    send_to_char(in_stack_ffffffffffffed70,
                 (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
  }
  else {
    ch_00 = (CHAR_DATA *)
            get_obj_carry(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                          in_stack_ffffffffffffff68);
    if (ch_00 == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffed70,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
    }
    else if (in_RDI->fighting == (CHAR_DATA *)0x0) {
      bVar1 = is_immortal(in_stack_ffffffffffffed58);
      if (!bVar1) {
        if ((*(short *)&ch_00->carrying != 0x13) && (*(short *)&ch_00->carrying != 0x1a)) {
          send_to_char(in_stack_ffffffffffffed70,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
          return;
        }
        bVar1 = is_npc(in_stack_ffffffffffffed58);
        if ((!bVar1) && (in_RDI->pcdata->condition[3] < 5)) {
          send_to_char(in_stack_ffffffffffffed70,
                       (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
          return;
        }
      }
      ch_01 = (CHAR_DATA *)0x0;
      act(in_stack_ffffffffffffed70,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68),(void *)0x0,
          in_stack_ffffffffffffed58,0);
      act(in_stack_ffffffffffffed70,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68),ch_01,
          in_stack_ffffffffffffed58,0);
      iVar2 = (int)*(short *)&ch_00->carrying;
      if (iVar2 == 0x13) {
        bVar1 = is_npc(in_stack_ffffffffffffed58);
        if (!bVar1) {
          iCond = (int)in_RDI->pcdata->condition[3];
          gain_condition(ch_00,iCond,in_stack_ffffffffffffedd8);
          if ((in_RDI->pcdata->condition[3] < 0x32) && (0x32 < iCond)) {
            send_to_char(in_stack_ffffffffffffed70,
                         (CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffed68));
          }
          else if (in_RDI->pcdata->condition[3] < 5) {
            send_to_char(in_stack_ffffffffffffed70,
                         (CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffed68));
          }
        }
        if (*(int *)&ch_00->prefix != 0) {
          act(in_stack_ffffffffffffed70,(CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffed68),ch_01
              ,in_stack_ffffffffffffed58,0);
          send_to_char(in_stack_ffffffffffffed70,
                       (CHAR_DATA *)CONCAT44(iVar2,in_stack_ffffffffffffed68));
          bVar1 = is_affected(in_RDI,(int)gsn_poison);
          if (!bVar1) {
            init_affect((AFFECT_DATA *)0x57603f);
            number_fuzzy((int)((ulong)ch_01 >> 0x20));
            std::pow<int,int>(0,0x5760a7);
            affect_join(ch_01,(AFFECT_DATA *)in_stack_ffffffffffffed58);
          }
        }
      }
      else if (iVar2 == 0x1a) {
        obj_cast_spell(in_stack_ffffffffffffedc4,in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8
                       ,in_stack_ffffffffffffedb0,
                       (OBJ_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
        obj_cast_spell(in_stack_ffffffffffffedc4,in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8
                       ,in_stack_ffffffffffffedb0,
                       (OBJ_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
        obj_cast_spell(in_stack_ffffffffffffedc4,in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8
                       ,in_stack_ffffffffffffedb0,
                       (OBJ_DATA *)CONCAT44(in_stack_ffffffffffffedac,in_stack_ffffffffffffeda8));
      }
      extract_obj(in_stack_ffffffffffffed80);
    }
    else {
      send_to_char(in_stack_ffffffffffffed70,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffed6c,in_stack_ffffffffffffed68));
    }
  }
  return;
}

Assistant:

void do_eat(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;

	one_argument(argument, arg);
	if (arg[0] == '\0')
	{
		send_to_char("Eat what?\n\r", ch);
		return;
	}

	obj = get_obj_carry(ch, arg, ch);

	if (obj == nullptr)
	{
		send_to_char("You do not have that item.\n\r", ch);
		return;
	}

	if (ch->fighting != nullptr)
	{
		send_to_char("You're too busy fighting to worry about food.\n\r", ch);
		return;
	}

	if (!is_immortal(ch))
	{
		if (obj->item_type != ITEM_FOOD && obj->item_type != ITEM_PILL)
		{
			send_to_char("That's not edible.\n\r", ch);
			return;
		}

		if (!is_npc(ch) && ch->pcdata->condition[COND_HUNGER] < 5)
		{
			send_to_char("You are too full to eat more.\n\r", ch);
			return;
		}
	}

	act("$n eats $p.", ch, obj, nullptr, TO_ROOM);
	act("You eat $p.", ch, obj, nullptr, TO_CHAR);

	switch (obj->item_type)
	{
		case ITEM_FOOD:
			if (!is_npc(ch))
			{
				int condition;

				condition = ch->pcdata->condition[COND_HUNGER];
				gain_condition(ch, COND_HUNGER, -(obj->value[1] * 3));

				if (ch->pcdata->condition[COND_HUNGER] < COND_HUNGRY && condition > COND_HUNGRY)
					send_to_char("You are no longer hungry.\n\r", ch);
				else if (ch->pcdata->condition[COND_HUNGER] < 5)
					send_to_char("You are full.\n\r", ch);
			}

			if (obj->value[3] != 0)
			{
				/* The food was poisoned! */
				AFFECT_DATA af;

				act("$n chokes and gags.", ch, 0, 0, TO_ROOM);
				send_to_char("You choke and gag.\n\r", ch);

				if (!is_affected(ch, gsn_poison))
				{
					init_affect(&af);
					af.where = TO_AFFECTS;
					af.aftype = AFT_MALADY;
					af.type = gsn_poison;
					af.level = number_fuzzy(obj->value[0]);
					af.duration = 2 * obj->value[0];
					af.location = APPLY_STR;
					af.modifier = -5;
					SET_BIT(af.bitvector, AFF_POISON);
					af.owner = ch;
					af.tick_fun = poison_tick;
					affect_join(ch, &af);
				}
			}

			break;
		case ITEM_PILL:
			obj_cast_spell(obj->value[1], obj->value[0], ch, ch, nullptr);
			obj_cast_spell(obj->value[2], obj->value[0], ch, ch, nullptr);
			obj_cast_spell(obj->value[3], obj->value[0], ch, ch, nullptr);
			break;
	}

	extract_obj(obj);
}